

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtype.cpp
# Opt level: O0

void __thiscall vm_val_t::cast_to_num(vm_val_t *this,vm_val_t *retval)

{
  CVmObject *pCVar1;
  vm_val_t *in_RSI;
  int *in_RDI;
  char *p;
  int in_stack_00000048;
  int in_stack_0000004c;
  size_t in_stack_00000050;
  char *in_stack_00000058;
  vm_val_t *in_stack_00000060;
  
  switch((CVmPoolInMem *)(ulong)(*in_RDI - 1)) {
  case (CVmPoolInMem *)0x0:
    set_int(in_RSI,0);
    break;
  case (CVmPoolInMem *)0x1:
    set_int(in_RSI,1);
    break;
  default:
    err_throw(0);
  case (CVmPoolInMem *)0x4:
    pCVar1 = vm_objp(0);
    (*pCVar1->_vptr_CVmObject[0x2b])(pCVar1,in_RSI,(ulong)(uint)in_RDI[2]);
    break;
  case (CVmPoolInMem *)0x6:
    set_int(in_RSI,in_RDI[2]);
    break;
  case (CVmPoolInMem *)0x7:
    CVmPoolInMem::get_ptr((CVmPoolInMem *)(ulong)(*in_RDI - 1),(pool_ofs_t)((ulong)in_RDI >> 0x20));
    vmb_get_len((char *)0x349997);
    CVmObjString::parse_num_val
              (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_0000004c,
               in_stack_00000048);
  }
  return;
}

Assistant:

void vm_val_t::cast_to_num(VMG_ vm_val_t *retval) const
{
    /* check the type */
    switch (typ)
    {
    case VM_TRUE:
        retval->set_int(1);
        break;

    case VM_NIL:
        retval->set_int(0);
        break;
        
    case VM_INT:
        /* it's already numeric */
        retval->set_int(val.intval);
        break;

    case VM_SSTRING:
        {
            /* get the string constant */
            const char *p = G_const_pool->get_ptr(val.ofs);

            /* parse it as an integer */
            CVmObjString::parse_num_val(
                vmg_ retval, p + VMB_LEN, vmb_get_len(p), 10, FALSE);
        }
        break;

    case VM_OBJ:
        /* ask the object to do the conversion */
        vm_objp(vmg_ val.obj)->cast_to_num(vmg_ retval, val.obj);
        break;

    default:
        /* there's no numeric conversion */
        err_throw(VMERR_NO_NUM_CONV);
    }
}